

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O1

void initialize_tls_values(thread_local_state *tls)

{
  ALLEGRO_COLOR AVar1;
  
  memset(tls,0,0x228);
  tls->new_display_adapter = -1;
  tls->new_window_x = 0x7fffffff;
  tls->new_window_y = 0x7fffffff;
  (tls->current_blender).blend_op = 0;
  (tls->current_blender).blend_source = 1;
  (tls->current_blender).blend_dest = 3;
  (tls->current_blender).blend_alpha_op = 0;
  (tls->current_blender).blend_alpha_source = 1;
  (tls->current_blender).blend_alpha_dest = 3;
  AVar1 = al_map_rgba_f(1.0,1.0,1.0,1.0);
  (tls->current_blender).blend_color = AVar1;
  tls->new_bitmap_format = 2;
  tls->new_bitmap_flags = 0x1000;
  tls->new_file_interface = &_al_file_interface_stdio;
  tls->fs_interface = &_al_fs_interface_stdio;
  memset(tls->new_window_title,0,0x100);
  _al_fill_display_settings(&tls->new_display_settings);
  return;
}

Assistant:

static void initialize_tls_values(thread_local_state *tls)
{
   memset(tls, 0, sizeof *tls);

   tls->new_display_adapter = ALLEGRO_DEFAULT_DISPLAY_ADAPTER;
   tls->new_window_x = INT_MAX;
   tls->new_window_y = INT_MAX;

   initialize_blender(&tls->current_blender);
   tls->new_bitmap_flags = ALLEGRO_CONVERT_BITMAP;
   tls->new_bitmap_format = ALLEGRO_PIXEL_FORMAT_ANY_WITH_ALPHA;
   tls->new_file_interface = &_al_file_interface_stdio;
   tls->fs_interface = &_al_fs_interface_stdio;
   memset(tls->new_window_title, 0, ALLEGRO_NEW_WINDOW_TITLE_MAX_SIZE + 1);

   _al_fill_display_settings(&tls->new_display_settings);
}